

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::setBuddy(QLabel *this,QWidget *buddy)

{
  QPointer<QWidget> *this_00;
  QLabelPrivate *this_01;
  Data *pDVar1;
  bool bVar2;
  ushort uVar3;
  QObject *sender;
  long in_FS_OFFSET;
  Object local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00 = &this_01->buddy;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      sender = (Object *)0x0;
    }
    else {
      sender = (this_01->buddy).wp.value;
    }
    QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QLabelPrivate::*)()>
              (sender,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,(Function)this_01)
    ;
  }
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,&buddy->super_QObject);
  if (buddy != (QWidget *)0x0) {
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QLabelPrivate::*)()>
              (local_30,(offset_in_QObject_to_subr)buddy,(Object *)QObject::destroyed,0,
               (ConnectionType)this_01);
    QMetaObject::Connection::~Connection((Connection *)local_30);
  }
  uVar3 = *(ushort *)&this_01->field_0x340;
  if ((uVar3 & 0x10) != 0) {
    if (this_01->shortcutId != 0) {
      QWidget::releaseShortcut((QWidget *)this,this_01->shortcutId);
      uVar3 = *(ushort *)&this_01->field_0x340;
    }
    this_01->shortcutId = 0;
    *(ushort *)&this_01->field_0x340 = uVar3 | 8;
    if (buddy != (QWidget *)0x0) {
      QLabelPrivate::updateShortcut(this_01);
    }
    QLabelPrivate::updateLabel(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setBuddy(QWidget *buddy)
{
    Q_D(QLabel);

    if (d->buddy)
        QObjectPrivate::disconnect(d->buddy, &QObject::destroyed,
                                   d, &QLabelPrivate::buddyDeleted);

    d->buddy = buddy;

    if (buddy)
        QObjectPrivate::connect(buddy, &QObject::destroyed,
                                d, &QLabelPrivate::buddyDeleted);

    if (d->isTextLabel) {
        if (d->shortcutId)
            releaseShortcut(d->shortcutId);
        d->shortcutId = 0;
        d->textDirty = true;
        if (buddy)
            d->updateShortcut(); // grab new shortcut
        d->updateLabel();
    }
}